

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::SetDateFormat
          (CSVReaderOptions *this,LogicalTypeId type,string *format,bool read_format)

{
  bool bVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  InvalidInputException *this_02;
  LogicalTypeId type_local;
  string error;
  string local_168;
  string auto_format;
  string local_128;
  StrpTimeFormat strpformat;
  StrTimeFormat local_90;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  type_local = type;
  StringUtil::Lower((string *)&auto_format,(string *)format);
  bVar1 = ::std::operator!=(&auto_format,"auto");
  if (bVar1) {
    if (read_format) {
      StrpTimeFormat::StrpTimeFormat(&strpformat);
      StrTimeFormat::ParseFormatSpecifier(&local_128,format,&strpformat.super_StrTimeFormat);
      ::std::__cxx11::string::operator=((string *)&error,(string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_128);
      this_00 = ::std::
                map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                ::operator[](&(this->dialect_options).date_format,&type_local);
      StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)&local_90,&strpformat);
      CSVOption<duckdb::StrpTimeFormat>::Set(this_00,(StrpTimeFormat *)&local_90,true);
      StrTimeFormat::~StrTimeFormat(&local_90);
      StrTimeFormat::~StrTimeFormat(&strpformat.super_StrTimeFormat);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_168,(string *)format);
      Value::Value((Value *)&strpformat,&local_168);
      this_01 = ::std::
                map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                ::operator[](&this->write_date_format,&type_local);
      Value::operator=(this_01,(Value *)&strpformat);
      Value::~Value((Value *)&strpformat);
      ::std::__cxx11::string::~string((string *)&local_168);
    }
    if (error._M_string_length != 0) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&strpformat,"Could not parse DATEFORMAT: %s",(allocator *)&local_128);
      InvalidInputException::InvalidInputException<char_const*>
                (this_02,(string *)&strpformat,error._M_dataplus._M_p);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ::std::__cxx11::string::~string((string *)&auto_format);
  ::std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void CSVReaderOptions::SetDateFormat(LogicalTypeId type, const string &format, bool read_format) {
	string error;
	const string auto_format = StringUtil::Lower(format);
	if (auto_format != "auto") {
		if (read_format) {
			StrpTimeFormat strpformat;
			error = StrTimeFormat::ParseFormatSpecifier(format, strpformat);
			dialect_options.date_format[type].Set(strpformat);
		} else {
			write_date_format[type] = Value(format);
		}
		if (!error.empty()) {
			throw InvalidInputException("Could not parse DATEFORMAT: %s", error.c_str());
		}
	}
}